

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O3

int CreateBotDist(DdNode *node,st__table *pathTable,uint *pathLengthArray,FILE *fp)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int *piVar8;
  uint uVar9;
  size_t __size;
  char *__ptr;
  NodeDist_t *nodeStatChild;
  NodeDist_t *nodeStat;
  char *local_48;
  int *local_40;
  ulong local_38;
  
  piVar8 = (int *)((ulong)node & 0xfffffffffffffffe);
  iVar2 = 1;
  if (*piVar8 != 0x7fffffff) {
    iVar2 = st__lookup(pathTable,(char *)piVar8,(char **)&local_40);
    if (iVar2 == 0) {
      __ptr = "Something wrong, the entry doesn\'t exist\n";
      __size = 0x29;
LAB_0079a556:
      fwrite(__ptr,__size,1,(FILE *)fp);
LAB_0079a565:
      iVar2 = 0;
    }
    else {
      uVar5 = 0xffffffff;
      uVar4 = 0xffffffff;
      if ((*local_40 != -1) && (uVar4 = *local_40 + local_40[2], local_40[2] == -1)) {
        uVar4 = 0xffffffff;
      }
      if ((local_40[1] != -1) && (uVar5 = local_40[1] + local_40[3], local_40[3] == -1)) {
        uVar5 = 0xffffffff;
      }
      if (uVar4 < uVar5) {
        uVar5 = uVar4;
      }
      uVar6 = *(ulong *)(piVar8 + 4);
      uVar1 = *(ulong *)(piVar8 + 6);
      local_38 = (ulong)((uint)node & 1);
      piVar8 = local_40;
      for (iVar2 = 0; (uVar7 = uVar6, iVar2 == 0 || (uVar7 = uVar1, iVar2 != 2)); iVar2 = iVar2 + 1)
      {
        if (*(int *)(uVar7 & 0xfffffffffffffffe) == 0x7fffffff) {
          if ((uVar7 & 1) == 0) {
            piVar8[3] = 1;
          }
          else {
            piVar8[2] = 1;
          }
        }
        else {
          iVar3 = st__lookup(pathTable,(char *)(uVar7 & 0xfffffffffffffffe),&local_48);
          if (iVar3 == 0) {
            __ptr = "Something wrong, node in table should have been created in top dist proc.\n";
            __size = 0x4a;
            goto LAB_0079a556;
          }
          if (*(int *)(local_48 + 8) == -1) {
            if (*(int *)(local_48 + 0xc) != -1) {
              __ptr = "Something wrong, both bot nodeStats should be there\n";
              __size = 0x34;
              goto LAB_0079a556;
            }
            iVar3 = CreateBotDist((DdNode *)(local_38 ^ uVar7),pathTable,pathLengthArray,fp);
            if (iVar3 == 0) goto LAB_0079a565;
          }
          uVar4 = 0xffffffff;
          if ((uVar7 & 1) == 0) {
            uVar9 = *(int *)(local_48 + 0xc) + 1U;
            if (*(int *)(local_48 + 0xc) + 1U == 0) {
              uVar9 = uVar4;
            }
            if (uVar9 < (uint)local_40[3]) {
              local_40[3] = uVar9;
            }
            iVar3 = *(int *)(local_48 + 8);
          }
          else {
            uVar9 = *(int *)(local_48 + 8) + 1U;
            if (*(int *)(local_48 + 8) + 1U == 0) {
              uVar9 = uVar4;
            }
            if (uVar9 < (uint)local_40[3]) {
              local_40[3] = uVar9;
            }
            iVar3 = *(int *)(local_48 + 0xc);
          }
          uVar9 = iVar3 + 1U;
          if (iVar3 + 1U == 0) {
            uVar9 = uVar4;
          }
          piVar8 = local_40;
          if (uVar9 < (uint)local_40[2]) {
            local_40[2] = uVar9;
          }
        }
      }
      uVar4 = 0xffffffff;
      uVar6 = 0xffffffff;
      if (*piVar8 != -1) {
        uVar9 = *piVar8 + piVar8[2];
        if (piVar8[2] == -1) {
          uVar9 = 0xffffffff;
        }
        uVar6 = (ulong)uVar9;
      }
      iVar2 = 1;
      if ((piVar8[1] != -1) && (uVar4 = piVar8[1] + piVar8[3], piVar8[3] == -1)) {
        uVar4 = 0xffffffff;
      }
      if ((uint)uVar6 < uVar5) {
        if (uVar5 != 0xffffffff) {
          pathLengthArray[uVar5] = pathLengthArray[uVar5] - 1;
        }
        pathLengthArray[uVar6] = pathLengthArray[uVar6] + 1;
        uVar5 = (uint)uVar6;
      }
      if (uVar4 < uVar5) {
        if (uVar5 != 0xffffffff) {
          pathLengthArray[uVar5] = pathLengthArray[uVar5] - 1;
        }
        pathLengthArray[uVar4] = pathLengthArray[uVar4] + 1;
      }
    }
  }
  return iVar2;
}

Assistant:

static NodeStat *
CreateBotDist(
  DdNode * node,
  st__table * distanceTable)
{
    DdNode *N, *Nv, *Nnv;
    int distance, distanceNv, distanceNnv;
    NodeStat *nodeStat, *nodeStatNv, *nodeStatNnv;

#if 0
    if (Cudd_IsConstant(node)) {
        return(0);
    }
#endif
    
    /* Return the entry in the table if found. */
    N = Cudd_Regular(node);
    if ( st__lookup(distanceTable, (const char *)N, (char **)&nodeStat)) {
        nodeStat->localRef++;
        return(nodeStat);
    }

    Nv = cuddT(N);
    Nnv = cuddE(N);
    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    /* Recur on the children. */
    nodeStatNv = CreateBotDist(Nv, distanceTable);
    if (nodeStatNv == NULL) return(NULL);
    distanceNv = nodeStatNv->distance;

    nodeStatNnv = CreateBotDist(Nnv, distanceTable);
    if (nodeStatNnv == NULL) return(NULL);
    distanceNnv = nodeStatNnv->distance;
    /* Store max distance from constant; note sometimes this distance
    ** may be to 0.
    */
    distance = (distanceNv > distanceNnv) ? (distanceNv+1) : (distanceNnv + 1);

    nodeStat = ABC_ALLOC(NodeStat, 1);
    if (nodeStat == NULL) {
        return(0);
    }
    nodeStat->distance = distance;
    nodeStat->localRef = 1;
    
    if ( st__insert(distanceTable, (char *)N, (char *)nodeStat) ==
        st__OUT_OF_MEM) {
        return(0);

    }
    return(nodeStat);

}